

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_error.hpp
# Opt level: O1

void __thiscall tao::pegtl::parse_error::parse_error(parse_error *this,string *msg,position *pos)

{
  long *plVar1;
  long *plVar2;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  to_string_abi_cxx11_(&local_40,(pegtl *)pos,pos);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_70 = *plVar2;
    lStack_68 = plVar1[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar2;
    local_80 = (long *)*plVar1;
  }
  local_78 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)(msg->_M_dataplus)._M_p)
  ;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
    local_60 = (long *)*plVar1;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_60);
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  *(undefined ***)this = &PTR__parse_error_00178bf8;
  (this->positions).super__Vector_base<tao::pegtl::position,_std::allocator<tao::pegtl::position>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->positions).super__Vector_base<tao::pegtl::position,_std::allocator<tao::pegtl::position>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->positions).super__Vector_base<tao::pegtl::position,_std::allocator<tao::pegtl::position>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<tao::pegtl::position,_std::allocator<tao::pegtl::position>_>::
  emplace_back<tao::pegtl::position>(&this->positions,pos);
  return;
}

Assistant:

parse_error( const std::string& msg, position&& pos )
            : std::runtime_error( to_string( pos ) + ": " + msg ),
              positions()
         {
            positions.emplace_back( std::move( pos ) );
         }